

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_quadratic_model.hpp
# Opt level: O2

void __thiscall
cimod::BinaryQuadraticModel<unsigned_int,_double,_cimod::Sparse>::_add_new_label
          (BinaryQuadraticModel<unsigned_int,_double,_cimod::Sparse> *this,uint label_i)

{
  iterator iVar1;
  uint local_14;
  
  local_14 = label_i;
  iVar1 = std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_long>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->_label_to_idx)._M_h,&local_14);
  if (iVar1.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_long>,_false>._M_cur ==
      (__node_type *)0x0) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (&this->_idx_to_label,&local_14);
    std::
    __sort<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_less_iter>
              ((this->_idx_to_label).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
               ._M_impl.super__Vector_impl_data._M_start,
               (this->_idx_to_label).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    _set_label_to_idx(this);
    _insert_label_into_mat<cimod::Sparse>(this,local_14,(dispatch_t<cimod::Sparse,_Sparse>)0x0);
  }
  return;
}

Assistant:

inline void _add_new_label( IndexType label_i ) {
      if ( _label_to_idx.find( label_i ) == _label_to_idx.end() ) {
        // add label_i
        _idx_to_label.push_back( label_i );
        std::sort( _idx_to_label.begin(), _idx_to_label.end() );
        _set_label_to_idx();

        _insert_label_into_mat( label_i );
      }
    }